

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,Catch *c)

{
  bool bVar1;
  Tag *name;
  Newline local_66;
  CloseBrace local_65;
  Newline local_64;
  Newline local_63;
  OpenBrace local_62;
  Newline local_61;
  Type local_60;
  Type local_58;
  StackVar local_50;
  uint local_44;
  FuncDeclaration *pFStack_40;
  Index num_params;
  FuncDeclaration *tag_type;
  Tag *tag;
  TagSymbol local_28;
  Catch *local_18;
  Catch *c_local;
  CWriter *this_local;
  
  local_18 = c;
  c_local = (Catch *)this;
  bVar1 = Catch::IsCatchAll(c);
  if (bVar1) {
    Write(this,&local_18->exprs);
  }
  else {
    name = Module::GetTag(this->module_,&local_18->var);
    TagSymbol::TagSymbol(&local_28,&name->name);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[32],wabt::(anonymous_namespace)::TagSymbol,char_const(&)[3],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,(char (*) [32])"if (wasm_rt_exception_tag() == ",&local_28,
               (char (*) [3])0x37f708,(OpenBrace *)((long)&tag + 7));
    tag_type = (FuncDeclaration *)Module::GetTag(this->module_,&local_18->var);
    pFStack_40 = &((Tag *)tag_type)->decl;
    local_44 = FuncDeclaration::GetNumParams(pFStack_40);
    PushTypes(this,&(pFStack_40->sig).param_types);
    if (local_44 == 1) {
      Type::Type(&local_58,Any);
      StackVar::StackVar(&local_50,0,local_58);
      local_60 = FuncDeclaration::GetParamType(pFStack_40,0);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[17],wabt::(anonymous_namespace)::StackVar,char_const(&)[31],wabt::Type,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [17])"wasm_rt_memcpy(&",&local_50,
                 (char (*) [31])", wasm_rt_exception(), sizeof(",&local_60,(char (*) [4])0x37d284,
                 &local_61);
    }
    else if (1 < local_44) {
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::OpenBrace,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[6],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_62,&(pFStack_40->sig).param_types,(char (*) [6])0x37e294,
                 &local_63);
      (anonymous_namespace)::CWriter::Write<char_const(&)[56],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,
                 (char (*) [56])"wasm_rt_memcpy(&tmp, wasm_rt_exception(), sizeof(tmp));",&local_64)
      ;
      Unspill(this,&(pFStack_40->sig).param_types);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_65,&local_66);
    }
    Write(this,&local_18->exprs);
    Write(this);
  }
  return;
}

Assistant:

void CWriter::Write(const Catch& c) {
  if (c.IsCatchAll()) {
    Write(c.exprs);
    return;
  }

  Write("if (wasm_rt_exception_tag() == ",
        TagSymbol(module_->GetTag(c.var)->name), ") ", OpenBrace());

  const Tag* tag = module_->GetTag(c.var);
  const FuncDeclaration& tag_type = tag->decl;
  const Index num_params = tag_type.GetNumParams();
  PushTypes(tag_type.sig.param_types);
  if (num_params == 1) {
    Write("wasm_rt_memcpy(&", StackVar(0), ", wasm_rt_exception(), sizeof(",
          tag_type.GetParamType(0), "));", Newline());
  } else if (num_params > 1) {
    Write(OpenBrace(), tag_type.sig.param_types, " tmp;", Newline());
    Write("wasm_rt_memcpy(&tmp, wasm_rt_exception(), sizeof(tmp));", Newline());
    Unspill(tag_type.sig.param_types);
    Write(CloseBrace(), Newline());
  }

  Write(c.exprs);
  Write(CloseBrace());
}